

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

bool __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::SetBlendFactors
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,float *BlendFactors,int param_2)

{
  Uint32 *pUVar1;
  COMMAND_QUEUE_TYPE CVar2;
  bool bVar3;
  Uint32 f;
  long lVar4;
  COMMAND_QUEUE_TYPE Type;
  COMMAND_QUEUE_TYPE extraout_DL;
  char (*in_R9) [8];
  string msg;
  string local_58;
  String local_38;
  
  Type = (COMMAND_QUEUE_TYPE)param_2;
  CVar2 = (this->m_Desc).QueueType;
  if (CVar2 == COMMAND_QUEUE_TYPE_UNKNOWN) {
    if ((this->m_Desc).IsDeferred == false) {
      FormatString<char[79]>
                (&local_58,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"SetBlendFactors",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x36c);
      std::__cxx11::string::~string((string *)&local_58);
    }
    FormatString<char[97]>
              (&local_58,
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"SetBlendFactors",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x36c);
    std::__cxx11::string::~string((string *)&local_58);
    CVar2 = (this->m_Desc).QueueType;
    Type = extraout_DL;
  }
  if ((~CVar2 & 7) != 0) {
    GetCommandQueueTypeString_abi_cxx11_(&local_38,(Diligent *)(ulong)CVar2,Type);
    FormatString<char[16],char[22],std::__cxx11::string,char[8]>
              (&local_58,(Diligent *)"SetBlendFactors",(char (*) [16])0x2e3525,
               (char (*) [22])&local_38,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    std::__cxx11::string::~string((string *)&local_38);
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"SetBlendFactors",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x36c);
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar3 = false;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    bVar3 = (bool)(bVar3 | (float)this->m_BlendFactors[lVar4] != BlendFactors[lVar4]);
    this->m_BlendFactors[lVar4] = (Float32)BlendFactors[lVar4];
  }
  if (bVar3) {
    pUVar1 = &(this->m_Stats).CommandCounters.SetBlendFactors;
    *pUVar1 = *pUVar1 + 1;
  }
  return bVar3;
}

Assistant:

inline bool DeviceContextBase<ImplementationTraits>::SetBlendFactors(const float* BlendFactors, int)
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "SetBlendFactors");

    bool FactorsDiffer = false;
    for (Uint32 f = 0; f < 4; ++f)
    {
        if (m_BlendFactors[f] != BlendFactors[f])
            FactorsDiffer = true;
        m_BlendFactors[f] = BlendFactors[f];
    }
    if (FactorsDiffer)
        ++m_Stats.CommandCounters.SetBlendFactors;

    return FactorsDiffer;
}